

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O3

int __thiscall FLineIdIterator::Next(FLineIdIterator *this)

{
  int iVar1;
  uint uVar2;
  FTagItem *pFVar3;
  
  pFVar3 = tagManager.allIDs.Array;
  uVar2 = this->start;
  if (-1 < (int)uVar2) {
    do {
      if (pFVar3[uVar2].tag == this->searchtag) goto LAB_00457e27;
      uVar2 = pFVar3[uVar2].nexttag;
      this->start = uVar2;
    } while (-1 < (int)uVar2);
  }
  pFVar3 = tagManager.allIDs.Array;
  if (uVar2 == 0xffffffff) {
    return -1;
  }
LAB_00457e27:
  iVar1 = pFVar3[(int)uVar2].target;
  this->start = pFVar3[(int)uVar2].nexttag;
  return iVar1;
}

Assistant:

int FLineIdIterator::Next()
{
	while (start >= 0 && tagManager.allIDs[start].tag != searchtag) start = tagManager.allIDs[start].nexttag;
	if (start == -1) return -1;
	int ret = tagManager.allIDs[start].target;
	start = tagManager.allIDs[start].nexttag;
	return ret;
}